

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::
SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6U>::
~SmallVector(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6U>
             *this)

{
  long *plVar1;
  void *pvVar2;
  long *plVar3;
  undefined1 *__ptr;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(this->
                 super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).
                 super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 .
                 super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 .super_SmallVectorBase.Size;
  if (uVar4 != 0) {
    pvVar2 = (this->
             super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             .
             super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             .super_SmallVectorBase.BeginX;
    lVar5 = uVar4 << 5;
    do {
      plVar1 = (long *)((long)pvVar2 + lVar5 + -0x10);
      plVar3 = *(long **)((long)pvVar2 + lVar5 + -0x20);
      if (plVar1 != plVar3) {
        operator_delete(plVar3,*plVar1 + 1);
      }
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != 0);
  }
  __ptr = (undefined1 *)
          (this->
          super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          .
          super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          .super_SmallVectorBase.BeginX;
  if ((SmallVectorStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6U>
       *)__ptr !=
      &this->
       super_SmallVectorStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6U>
     ) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }